

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void cfd::js::api::json::VerifyEcdsaAdaptorRequest::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>_>_>,_bool>
  pVar2;
  allocator local_401;
  string local_400 [32];
  _Base_ptr local_3e0;
  undefined1 local_3d8;
  undefined1 local_3d0 [64];
  function<std::__cxx11::string()> local_390 [39];
  allocator local_369;
  string local_368 [32];
  _Base_ptr local_348;
  undefined1 local_340;
  undefined1 local_338 [64];
  function<std::__cxx11::string()> local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  undefined1 local_2a0 [64];
  function<std::__cxx11::string()> local_260 [39];
  allocator local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  undefined1 local_208 [64];
  function<std::__cxx11::string()> local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  _Base_ptr local_180;
  undefined1 local_178;
  undefined1 local_170 [64];
  function<std::__cxx11::string()> local_130 [39];
  allocator local_109;
  string local_108 [32];
  _Base_ptr local_e8;
  undefined1 local_e0;
  undefined1 local_c8 [64];
  function<std::__cxx11::string()> local_88 [32];
  undefined1 local_68 [8];
  CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> func_table;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>_>_>_>
                   *)json_mapper_abi_cxx11_);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_68);
    std::function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>
                *)local_c8,GetAdaptorSignatureString_abi_cxx11_);
    std::function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)> *)
               (local_c8 + 0x20),SetAdaptorSignatureString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_88,GetAdaptorSignatureFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_c8);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_c8);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
            ::
            emplace<char_const(&)[17],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [17])"adaptorSignature",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)
                       local_68);
    local_e8 = (_Base_ptr)pVar2.first._M_node;
    local_e0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"adaptorSignature",&local_109);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>
                *)local_170,GetProofString_abi_cxx11_);
    std::function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)> *)
               (local_170 + 0x20),SetProofString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_130,GetProofFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_170);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_170);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
            ::
            emplace<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [6])0x17ea1f4,
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)
                       local_68);
    local_180 = (_Base_ptr)pVar2.first._M_node;
    local_178 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"proof",&local_1a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>
                *)local_208,GetAdaptorString_abi_cxx11_);
    std::function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)> *)
               (local_208 + 0x20),SetAdaptorString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_1c8,GetAdaptorFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_208);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_208);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [8])"adaptor",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)
                       local_68);
    local_218 = (_Base_ptr)pVar2.first._M_node;
    local_210 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"adaptor",&local_239);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_238);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>
                *)local_2a0,GetMessageString_abi_cxx11_);
    std::function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)> *)
               (local_2a0 + 0x20),SetMessageString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_260,GetMessageFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_2a0);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_2a0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [8])"message",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)
                       local_68);
    local_2b0 = (_Base_ptr)pVar2.first._M_node;
    local_2a8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"message",&local_2d1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_2d0);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    std::function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>
                *)local_338,GetIsHashedString_abi_cxx11_);
    std::function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)> *)
               (local_338 + 0x20),SetIsHashedString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_2f8,GetIsHashedFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_338);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_338);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [9])"isHashed",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)
                       local_68);
    local_348 = (_Base_ptr)pVar2.first._M_node;
    local_340 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"isHashed",&local_369);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_368);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    std::function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::VerifyEcdsaAdaptorRequest_const&)>
                *)local_3d0,GetPubkeyString_abi_cxx11_);
    std::function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::VerifyEcdsaAdaptorRequest&,UniValue_const&)> *)
               (local_3d0 + 0x20),SetPubkeyString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_390,GetPubkeyFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_3d0);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_3d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
            ::
            emplace<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [7])0x17e54b3,
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)
                       local_68);
    local_3e0 = (_Base_ptr)pVar2.first._M_node;
    local_3d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"pubkey",&local_401);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_400);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyEcdsaAdaptorRequest> *)local_68);
  }
  return;
}

Assistant:

void VerifyEcdsaAdaptorRequest::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<VerifyEcdsaAdaptorRequest> func_table;  // NOLINT

  func_table = {
    VerifyEcdsaAdaptorRequest::GetAdaptorSignatureString,
    VerifyEcdsaAdaptorRequest::SetAdaptorSignatureString,
    VerifyEcdsaAdaptorRequest::GetAdaptorSignatureFieldType,
  };
  json_mapper.emplace("adaptorSignature", func_table);
  item_list.push_back("adaptorSignature");
  func_table = {
    VerifyEcdsaAdaptorRequest::GetProofString,
    VerifyEcdsaAdaptorRequest::SetProofString,
    VerifyEcdsaAdaptorRequest::GetProofFieldType,
  };
  json_mapper.emplace("proof", func_table);
  item_list.push_back("proof");
  func_table = {
    VerifyEcdsaAdaptorRequest::GetAdaptorString,
    VerifyEcdsaAdaptorRequest::SetAdaptorString,
    VerifyEcdsaAdaptorRequest::GetAdaptorFieldType,
  };
  json_mapper.emplace("adaptor", func_table);
  item_list.push_back("adaptor");
  func_table = {
    VerifyEcdsaAdaptorRequest::GetMessageString,
    VerifyEcdsaAdaptorRequest::SetMessageString,
    VerifyEcdsaAdaptorRequest::GetMessageFieldType,
  };
  json_mapper.emplace("message", func_table);
  item_list.push_back("message");
  func_table = {
    VerifyEcdsaAdaptorRequest::GetIsHashedString,
    VerifyEcdsaAdaptorRequest::SetIsHashedString,
    VerifyEcdsaAdaptorRequest::GetIsHashedFieldType,
  };
  json_mapper.emplace("isHashed", func_table);
  item_list.push_back("isHashed");
  func_table = {
    VerifyEcdsaAdaptorRequest::GetPubkeyString,
    VerifyEcdsaAdaptorRequest::SetPubkeyString,
    VerifyEcdsaAdaptorRequest::GetPubkeyFieldType,
  };
  json_mapper.emplace("pubkey", func_table);
  item_list.push_back("pubkey");
}